

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O1

Matrix<float,_3,_3> * math::matrix_inverse<float>(Matrix<float,_3,_3> *m,float *det)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  Matrix<float,_3,_3> *in_RDI;
  float local_30 [10];
  
  fVar1 = m->m[4];
  fVar2 = m->m[8];
  fVar3 = m->m[5];
  fVar4 = m->m[7];
  fVar5 = m->m[1];
  fVar6 = m->m[6];
  fVar7 = m->m[2];
  fVar8 = m->m[0];
  fVar9 = m->m[3];
  local_30[0] = fVar1 * fVar2 - fVar4 * fVar3;
  local_30[1] = fVar7 * fVar4 - fVar2 * fVar5;
  local_30[2] = fVar5 * fVar3 - fVar1 * fVar7;
  local_30[3] = fVar3 * fVar6 - fVar2 * fVar9;
  local_30[4] = fVar8 * fVar2 - fVar6 * fVar7;
  local_30[5] = fVar7 * fVar9 - fVar3 * fVar8;
  local_30[6] = fVar9 * fVar4 - fVar6 * fVar1;
  local_30[7] = fVar5 * fVar6 - fVar4 * fVar8;
  local_30[8] = fVar8 * fVar1 - fVar9 * fVar5;
  fVar1 = *det;
  lVar10 = 0;
  do {
    *(float *)((long)local_30 + lVar10) = *(float *)((long)local_30 + lVar10) / fVar1;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x24);
  in_RDI->m[8] = local_30[8];
  *(ulong *)(in_RDI->m + 4) = CONCAT44(local_30[5],local_30[4]);
  *(ulong *)(in_RDI->m + 6) = CONCAT44(local_30[7],local_30[6]);
  *(ulong *)in_RDI->m = CONCAT44(local_30[1],local_30[0]);
  *(ulong *)(in_RDI->m + 2) = CONCAT44(local_30[3],local_30[2]);
  return in_RDI;
}

Assistant:

Matrix<T,3,3>
matrix_inverse (Matrix<T,3,3> const& m, T const& det)
{
    Matrix<T,3,3> ret;
    ret[0] = m[4] * m[8] - m[5] * m[7];
    ret[1] = m[2] * m[7] - m[1] * m[8];
    ret[2] = m[1] * m[5] - m[2] * m[4];
    ret[3] = m[5] * m[6] - m[3] * m[8];
    ret[4] = m[0] * m[8] - m[2] * m[6];
    ret[5] = m[2] * m[3] - m[0] * m[5];
    ret[6] = m[3] * m[7] - m[4] * m[6];
    ret[7] = m[1] * m[6] - m[0] * m[7];
    ret[8] = m[0] * m[4] - m[1] * m[3];
    return ret / det;
}